

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O0

void __thiscall
arangodb::velocypack::Validator::validateUnindexedArray(Validator *this,uint8_t *ptr,size_t length)

{
  undefined8 uVar1;
  Exception *this_00;
  char *msg;
  ValueLength VVar2;
  ulong in_RDX;
  char *in_RSI;
  undefined8 in_RDI;
  bool bVar3;
  size_t unaff_retaddr;
  uint8_t *in_stack_00000008;
  Validator *in_stack_00000010;
  ValueLength nrItems;
  ValueLength itemSize;
  uint8_t *e;
  uint8_t *p;
  ValueLength byteSize;
  ValueLength byteSizeLength;
  uint8_t head;
  undefined8 in_stack_ffffffffffffff58;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffff60;
  uint8_t *in_stack_ffffffffffffff68;
  ExceptionType EVar4;
  Exception *in_stack_ffffffffffffff70;
  Slice local_60;
  ulong local_58;
  Slice local_50;
  ValueLength local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  unsigned_long local_30;
  long local_28;
  char local_19;
  ulong local_18;
  char *local_10;
  
  local_19 = *in_RSI;
  local_28 = 1L << (local_19 - 2U & 0x3f);
  local_18 = in_RDX;
  local_10 = in_RSI;
  validateBufferLength
            ((Validator *)in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,
             (size_t)in_stack_ffffffffffffff60,SUB81((ulong)in_stack_ffffffffffffff58 >> 0x38,0));
  local_30 = readIntegerNonEmpty<unsigned_long>
                       (in_stack_ffffffffffffff68,(ValueLength)in_stack_ffffffffffffff60);
  EVar4 = (ExceptionType)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  if (local_18 < local_30) {
    uVar1 = __cxa_allocate_exception(0x18);
    Exception::Exception(in_stack_ffffffffffffff70,EVar4,(char *)in_stack_ffffffffffffff60);
    __cxa_throw(uVar1,&Exception::typeinfo,Exception::~Exception);
  }
  local_38 = (uint8_t *)(local_10 + local_28 + 1);
  local_40 = local_38 + (8 - local_28);
  if (local_10 + local_30 < local_40) {
    local_40 = (uint8_t *)(local_10 + local_30);
  }
  while( true ) {
    bVar3 = false;
    if (local_38 < local_40) {
      bVar3 = *local_38 == '\0';
    }
    if (!bVar3) break;
    local_38 = local_38 + 1;
  }
  if (local_10 + local_30 <= local_38) {
    uVar1 = __cxa_allocate_exception(0x18);
    Exception::Exception(in_stack_ffffffffffffff70,EVar4,(char *)in_stack_ffffffffffffff60);
    __cxa_throw(uVar1,&Exception::typeinfo,Exception::~Exception);
  }
  if ((local_38 != (uint8_t *)(local_10 + local_28 + 1)) && (local_38 != (uint8_t *)(local_10 + 9)))
  {
    uVar1 = __cxa_allocate_exception(0x18);
    Exception::Exception(in_stack_ffffffffffffff70,EVar4,(char *)in_stack_ffffffffffffff60);
    __cxa_throw(uVar1,&Exception::typeinfo,Exception::~Exception);
  }
  validatePart(in_stack_00000010,in_stack_00000008,unaff_retaddr,SUB81((ulong)in_RDI >> 0x38,0));
  Slice::Slice(&local_50,local_38);
  local_48 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                       (in_stack_ffffffffffffff60);
  EVar4 = (ExceptionType)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  if (local_48 == 0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(this_00,EVar4,(char *)in_stack_ffffffffffffff60);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  local_58 = (local_30 - ((long)local_38 - (long)local_10)) / local_48;
  if (local_58 != 0) {
    local_38 = local_38 + local_48;
    local_40 = (uint8_t *)(local_10 + local_18);
    while( true ) {
      local_58 = local_58 - 1;
      EVar4 = (ExceptionType)((ulong)in_stack_ffffffffffffff68 >> 0x20);
      if (local_58 == 0) {
        return;
      }
      if (local_40 <= local_38) break;
      validatePart(in_stack_00000010,in_stack_00000008,unaff_retaddr,SUB81((ulong)in_RDI >> 0x38,0))
      ;
      Slice::Slice(&local_60,local_38);
      VVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                        (in_stack_ffffffffffffff60);
      EVar4 = (ExceptionType)((ulong)in_stack_ffffffffffffff68 >> 0x20);
      if (VVar2 != local_48) {
        uVar1 = __cxa_allocate_exception(0x18);
        Exception::Exception(in_stack_ffffffffffffff70,EVar4,(char *)in_stack_ffffffffffffff60);
        __cxa_throw(uVar1,&Exception::typeinfo,Exception::~Exception);
      }
      local_38 = local_38 + local_48;
    }
    msg = (char *)__cxa_allocate_exception(0x18);
    Exception::Exception(in_stack_ffffffffffffff70,EVar4,msg);
    __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
  }
  uVar1 = __cxa_allocate_exception(0x18);
  Exception::Exception
            (in_stack_ffffffffffffff70,(ExceptionType)((ulong)uVar1 >> 0x20),
             (char *)in_stack_ffffffffffffff60);
  __cxa_throw(uVar1,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateUnindexedArray(uint8_t const* ptr, std::size_t length) {
  // Array without index table, with 1-8 bytes lengths, all values with same
  // length
  uint8_t head = *ptr;
  ValueLength const byteSizeLength =
      1ULL << (static_cast<ValueLength>(head) - 0x02U);
  validateBufferLength(1 + byteSizeLength + 1, length, true);
  ValueLength const byteSize =
      readIntegerNonEmpty<ValueLength>(ptr + 1, byteSizeLength);

  if (byteSize > length) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array length is out of bounds");
  }

  // look up first member
  uint8_t const* p = ptr + 1 + byteSizeLength;
  uint8_t const* e = p + (8 - byteSizeLength);

  if (e > ptr + byteSize) {
    e = ptr + byteSize;
  }
  while (p < e && *p == '\x00') {
    ++p;
  }

  if (p >= ptr + byteSize) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array structure is invalid");
  }

  // check if padding is correct
  if (p != ptr + 1 + byteSizeLength &&
      p != ptr + 1 + byteSizeLength + (8 - byteSizeLength)) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array padding is invalid");
  }

  validatePart(p, length - (p - ptr), true);
  ValueLength itemSize = Slice(p).byteSize();
  if (itemSize == 0) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array itemSize value is invalid");
  }
  ValueLength nrItems = (byteSize - (p - ptr)) / itemSize;

  if (nrItems == 0) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array nrItems value is invalid");
  }
  // we already validated p, so move it forward
  p += itemSize;
  e = ptr + length;
  --nrItems;

  while (nrItems > 0) {
    if (p >= e) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array value is out of bounds");
    }
    // validate sub value
    validatePart(p, e - p, true);
    if (Slice(p).byteSize() != itemSize) {
      // got a sub-object with a different size. this is not allowed
      throw Exception(Exception::ValidatorInvalidLength,
                      "Unexpected Array value length");
    }
    p += itemSize;
    --nrItems;
  }
}